

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

void fdb_file_handle_clone_cmp_func_list(fdb_file_handle *fhandle,list *cmp_func_list)

{
  list_elem *plVar1;
  list_elem *plVar2;
  list *plVar3;
  undefined8 *puVar4;
  size_t sVar5;
  char *__dest;
  
  if ((cmp_func_list != (list *)0x0) && (fhandle->cmp_func_list == (list *)0x0)) {
    plVar3 = (list *)calloc(1,0x10);
    fhandle->cmp_func_list = plVar3;
    while (plVar1 = cmp_func_list->head, plVar1 != (list_elem *)0x0) {
      puVar4 = (undefined8 *)calloc(1,0x28);
      if (plVar1[-2].next == (list_elem *)0x0) {
        *puVar4 = 0;
      }
      else {
        sVar5 = strlen((char *)plVar1[-2].next);
        __dest = (char *)calloc(1,sVar5 + 1);
        *puVar4 = __dest;
        strcpy(__dest,(char *)plVar1[-2].next);
      }
      plVar2 = plVar1[-1].next;
      puVar4[1] = plVar1[-1].prev;
      puVar4[2] = plVar2;
      list_push_back(fhandle->cmp_func_list,(list_elem *)(puVar4 + 3));
      cmp_func_list = (list *)&plVar1->next;
    }
  }
  return;
}

Assistant:

void fdb_file_handle_clone_cmp_func_list(fdb_file_handle *fhandle,
                                         struct list *cmp_func_list)
{
    struct list_elem *e;
    struct cmp_func_node *src, *dst;

    if (fhandle->cmp_func_list || /* already exist */
        !cmp_func_list) {
        return;
    }

    fhandle->cmp_func_list = (struct list*)calloc(1, sizeof(struct list));
    list_init(fhandle->cmp_func_list);

    e = list_begin(cmp_func_list);
    while (e) {
        src = _get_entry(e, struct cmp_func_node, le);
        dst = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
        if (src->kvs_name) {
            dst->kvs_name = (char*)calloc(1, strlen(src->kvs_name)+1);
            strcpy(dst->kvs_name, src->kvs_name);
        } else {
            dst->kvs_name = NULL; // default KVS
        }
        dst->func = src->func;
        dst->user_param = src->user_param;
        list_push_back(fhandle->cmp_func_list, &dst->le);
        e = list_next(&src->le);
    }
}